

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minja.hpp
# Opt level: O3

shared_ptr<minja::Value> __thiscall minja::Parser::parseConstant(Parser *this)

{
  CharIterator *end;
  char *pcVar1;
  char *pcVar2;
  int iVar3;
  runtime_error *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_04;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_05;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_06;
  char *pcVar4;
  Parser *in_RSI;
  shared_ptr<minja::Value> sVar5;
  string token;
  json number;
  bool local_71;
  undefined1 local_70 [16];
  undefined1 local_60 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_50 [2];
  
  end = &in_RSI->it;
  pcVar1 = (in_RSI->end)._M_current;
  pcVar2 = (in_RSI->it)._M_current;
  pcVar4 = pcVar2;
  while ((pcVar4 != pcVar1 &&
         (iVar3 = isspace((int)*pcVar4), in_RDX._M_pi = extraout_RDX, iVar3 != 0))) {
    pcVar4 = pcVar4 + 1;
    end->_M_current = pcVar4;
  }
  if (pcVar4 == pcVar1) {
    (this->template_str).
    super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)0x0;
    (this->template_str).
    super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  }
  else if (((*pcVar4 == '\'') || (*pcVar4 == '\"')) &&
          (parseString_abi_cxx11_((Parser *)local_70),
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70._0_8_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
    std::__shared_ptr<minja::Value,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<std::allocator<minja::Value>,std::__cxx11::string&>
              ((__shared_ptr<minja::Value,(__gnu_cxx::_Lock_policy)2> *)this,
               (allocator<minja::Value> *)(local_60 + 0x10),
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70._0_8_);
    in_RDX._M_pi = extraout_RDX_00;
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70._0_8_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)local_70,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_70._0_8_);
      in_RDX._M_pi = extraout_RDX_01;
    }
  }
  else {
    if ((parseConstant()::prim_tok_abi_cxx11_ == '\0') &&
       (iVar3 = __cxa_guard_acquire(&parseConstant()::prim_tok_abi_cxx11_), iVar3 != 0)) {
      std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
                (&parseConstant()::prim_tok_abi_cxx11_,"true\\b|True\\b|false\\b|False\\b|None\\b",
                 0x10);
      __cxa_atexit(std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex,
                   &parseConstant()::prim_tok_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&parseConstant()::prim_tok_abi_cxx11_);
    }
    consumeToken((string *)local_70,in_RSI,&parseConstant()::prim_tok_abi_cxx11_,Strip);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_70._8_8_ ==
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      parseNumber((Parser *)(local_60 + 0x10),(CharIterator *)in_RSI,end);
      if (local_50[0]._M_local_buf[0] == '\0') {
        end->_M_current = pcVar2;
        (this->template_str).
        super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr = (element_type *)0x0;
        (this->template_str).
        super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      }
      else {
        std::__shared_ptr<minja::Value,(__gnu_cxx::_Lock_policy)2>::
        __shared_ptr<std::allocator<minja::Value>,nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>&>
                  ((__shared_ptr<minja::Value,(__gnu_cxx::_Lock_policy)2> *)this,
                   (allocator<minja::Value> *)&local_71,
                   (basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                    *)(local_60 + 0x10));
      }
      nlohmann::json_abi_v3_11_3::
      basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::assert_invariant((basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                          *)(local_60 + 0x10),false);
      nlohmann::json_abi_v3_11_3::
      basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::data::~data((data *)(local_60 + 0x10));
      in_RDX._M_pi = extraout_RDX_05;
    }
    else {
      iVar3 = std::__cxx11::string::compare(local_70);
      if ((iVar3 == 0) || (iVar3 = std::__cxx11::string::compare(local_70), iVar3 == 0)) {
        local_71 = true;
        std::__shared_ptr<minja::Value,(__gnu_cxx::_Lock_policy)2>::
        __shared_ptr<std::allocator<minja::Value>,bool>
                  ((__shared_ptr<minja::Value,(__gnu_cxx::_Lock_policy)2> *)this,
                   (allocator<minja::Value> *)(local_60 + 0x10),&local_71);
        in_RDX._M_pi = extraout_RDX_03;
      }
      else {
        iVar3 = std::__cxx11::string::compare(local_70);
        if ((iVar3 == 0) || (iVar3 = std::__cxx11::string::compare(local_70), iVar3 == 0)) {
          local_71 = false;
          std::__shared_ptr<minja::Value,(__gnu_cxx::_Lock_policy)2>::
          __shared_ptr<std::allocator<minja::Value>,bool>
                    ((__shared_ptr<minja::Value,(__gnu_cxx::_Lock_policy)2> *)this,
                     (allocator<minja::Value> *)(local_60 + 0x10),&local_71);
          in_RDX._M_pi = extraout_RDX_04;
        }
        else {
          iVar3 = std::__cxx11::string::compare(local_70);
          if (iVar3 != 0) {
            this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           (local_60 + 0x10),"Unknown constant token: ",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_70);
            std::runtime_error::runtime_error(this_00,(string *)(local_60 + 0x10));
            __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
          local_50[0]._M_allocated_capacity = (char *)0x0;
          std::__shared_ptr<minja::Value,(__gnu_cxx::_Lock_policy)2>::
          __shared_ptr<std::allocator<minja::Value>,decltype(nullptr)>
                    ((__shared_ptr<minja::Value,(__gnu_cxx::_Lock_policy)2> *)this,
                     (allocator<minja::Value> *)&local_71,(void **)(local_60 + 0x10));
          in_RDX._M_pi = extraout_RDX_02;
        }
      }
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70._0_8_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60) {
      operator_delete((void *)local_70._0_8_,(ulong)(local_60._0_8_ + 1));
      in_RDX._M_pi = extraout_RDX_06;
    }
  }
  sVar5.super___shared_ptr<minja::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       in_RDX._M_pi;
  sVar5.super___shared_ptr<minja::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<minja::Value>)
         sVar5.super___shared_ptr<minja::Value,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Value> parseConstant() {
      auto start = it;
      consumeSpaces();
      if (it == end) return nullptr;
      if (*it == '"' || *it == '\'') {
        auto str = parseString();
        if (str) return std::make_shared<Value>(*str);
      }
      static std::regex prim_tok(R"(true\b|True\b|false\b|False\b|None\b)");
      auto token = consumeToken(prim_tok);
      if (!token.empty()) {
        if (token == "true" || token == "True") return std::make_shared<Value>(true);
        if (token == "false" || token == "False") return std::make_shared<Value>(false);
        if (token == "None") return std::make_shared<Value>(nullptr);
        throw std::runtime_error("Unknown constant token: " + token);
      }

      auto number = parseNumber(it, end);
      if (!number.is_null()) return std::make_shared<Value>(number);

      it = start;
      return nullptr;
    }